

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> * __thiscall
Lib::OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>::operator=
          (OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> *this,
          OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> *other)

{
  byte *in_RSI;
  OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> *in_RDI;
  VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *in_stack_ffffffffffffffb8;
  VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *in_stack_ffffffffffffffc0;
  MaybeUninit<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> *this_00;
  EVP_PKEY_CTX local_18 [8];
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> *)
           0x3e9427);
    VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::~VirtualIterator
              (in_stack_ffffffffffffffc0);
  }
  if ((*local_10 & 1) != 0) {
    this_00 = &in_RDI->_elem;
    unwrap((OptionBase<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_> *)
           0x3e9451);
    move_if_value<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>,_true>
              (in_stack_ffffffffffffffb8);
    MaybeUninit<Lib::VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>_>::init
              (this_00,local_18);
    VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*>::~VirtualIterator
              ((VirtualIterator<Inferences::ALASCA::FourierMotzkinConf::Lhs_*> *)this_00);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }